

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::write_gets(Rdma *this)

{
  ulong uVar1;
  pointer puVar2;
  unsigned_long uVar3;
  long lVar4;
  size_t slot;
  Time t_1;
  TicToc t;
  unsigned_long local_68;
  timespec local_60;
  TicToc local_50;
  
  local_50.m_record = TicToc::push(GET);
  clock_gettime(1,&local_60);
  local_50.m_start.tv_sec = local_60.tv_sec;
  local_50.m_start.tv_nsec = local_60.tv_nsec;
  local_50.m_nbytes = 0;
  if (0 < this->m_nprocs) {
    lVar4 = 0;
    do {
      uVar1 = (this->m_recv_actions).m_get_buffer_offset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      puVar2 = (this->m_second_exchange).m_recv_pos.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar2[lVar4];
      if (uVar1 <= (this->m_second_exchange).m_recv_sizes.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4] - uVar3) {
        puVar2[lVar4] = uVar3 + uVar1;
      }
      while (uVar3 = (this->m_second_exchange).m_recv_pos.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4],
            (this->m_second_exchange).m_recv_sizes.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] != uVar3) {
        deserial<unsigned_long>(&this->m_second_exchange,(int)lVar4,(unsigned_long *)&local_60);
        deserial<unsigned_long>(&this->m_second_exchange,(int)lVar4,&local_68);
        memcpy((this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_68],
               (this->m_second_exchange).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (this->m_second_exchange).m_recv_pos.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4] +
               (this->m_second_exchange).m_recv_cap * lVar4,local_60.tv_sec);
        puVar2 = (this->m_second_exchange).m_recv_pos.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = puVar2[lVar4];
        if ((ulong)local_60.tv_sec <=
            (this->m_second_exchange).m_recv_sizes.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] - uVar3) {
          puVar2[lVar4] = uVar3 + local_60.tv_sec;
        }
      }
      local_50.m_nbytes = local_50.m_nbytes + (uVar3 - uVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->m_nprocs);
  }
  TicToc::~TicToc(&local_50);
  return;
}

Assistant:

void Rdma::write_gets()
{
#ifdef PROFILE
    TicToc t(TicToc::GET );
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t start = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_pop( p, start );
        while ( m_second_exchange.recv_size( p ) > 0 ) {
            size_t size, slot;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, slot);
           
            char * dst_addr = static_cast<char *>(m_local_slots[ slot ]);

            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        size_t end = m_second_exchange.recv_pos(p);
        t.add_bytes( end - start );
#endif
   }
}